

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O2

void print_value(MOJOSHADER_effectValue *value,uint indent)

{
  MOJOSHADER_symbolType MVar1;
  MOJOSHADER_effectSamplerState *pMVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  
  do_indent(indent);
  printf("VALUE: %s -> %s\n",value->name,value->semantic);
  uVar8 = indent + 1;
  do_indent(uVar8);
  printf("CLASS: %s\n",
         print_value_classes_rel +
         *(int *)(print_value_classes_rel + (ulong)(value->type).parameter_class * 4));
  do_indent(uVar8);
  printf("TYPE: %s\n",print_value::types[(value->type).parameter_type]);
  do_indent(uVar8);
  printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",(ulong)(value->type).rows,
         (ulong)(value->type).columns,(ulong)(value->type).elements);
  do_indent(uVar8);
  printf("TOTAL VALUES: %d\n",(ulong)value->value_count);
  MVar1 = (value->type).parameter_type;
  do_indent(uVar8);
  if (MVar1 - MOJOSHADER_SYMTYPE_SAMPLER < 5) {
    puts("SAMPLER VALUES:");
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < value->value_count; uVar7 = uVar7 + 1) {
      pMVar2 = (value->field_4).valuesSS;
      do_indent(indent + 2);
      printf("TYPE: %s -> ",
             print_value_samplerstatetypes_rel +
             *(int *)(print_value_samplerstatetypes_rel +
                     (ulong)*(uint *)((long)&pMVar2->type + lVar6) * 4));
      pfVar3 = *(float **)((long)&(pMVar2->value).field_4 + lVar6);
      if (*(int *)((long)&pMVar2->type + lVar6) == 0xc) {
        printf("%.2f\n",(double)*pfVar3);
      }
      else {
        printf("%d\n",(ulong)(uint)*pfVar3);
      }
      lVar6 = lVar6 + 0x48;
    }
  }
  else {
    printf("%s VALUES:\n",print_value::types[(value->type).parameter_type]);
    uVar8 = 0;
    do {
      for (uVar4 = 0; uVar4 < (value->type).rows; uVar4 = uVar4 + 1) {
        do_indent(indent + 2);
        for (uVar5 = 0; uVar5 < (value->type).columns; uVar5 = uVar5 + 1) {
          uVar7 = (ulong)(value->type).parameter_type;
          lVar6 = (long)(int)(uVar5 + ((value->type).rows * uVar8 + uVar4) * 4);
          if (uVar7 == 3) {
            printf("%.2f ",(double)*(float *)((long)(value->field_4).values + lVar6 * 4));
          }
          else {
            printf(print_value_prints_rel + *(int *)(print_value_prints_rel + uVar7 * 4),
                   (ulong)*(uint *)((long)(value->field_4).values + lVar6 * 4));
          }
        }
        putchar(10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (value->type).elements);
  }
  return;
}

Assistant:

static void print_value(const MOJOSHADER_effectValue *value,
                        const unsigned int indent)
{
    int i, r, c;

    INDENT();
    printf("VALUE: %s -> %s\n", value->name, value->semantic);

    static const char *classes[] =
    {
        "SCALAR",
        "VECTOR",
        "ROW-MAJOR MATRIX",
        "COLUMN-MAJOR MATRIX",
        "OBJECT",
        "STRUCT"
    };
    static const char *types[] =
    {
        "VOID",
        "BOOL",
        "INT",
        "FLOAT",
        "STRING",
        "TEXTURE",
        "TEXTURE1D",
        "TEXTURE2D",
        "TEXTURE3D",
        "TEXTURECUBE",
        "SAMPLER",
        "SAMPLER1D",
        "SAMPLER2D",
        "SAMPLER3D",
        "SAMPLERCUBE",
        "PIXELSHADER",
        "VERTEXSHADER",
        "UNSUPPORTED"
    };
    do_indent(indent + 1);
    printf("CLASS: %s\n", classes[value->type.parameter_class]);
    do_indent(indent + 1);
    printf("TYPE: %s\n", types[value->type.parameter_type]);

    do_indent(indent + 1);
    printf("ROWS/COLUMNS/ELEMENTS: %d, %d, %d\n",
           value->type.rows, value->type.columns, value->type.elements);
    do_indent(indent + 1);
    printf("TOTAL VALUES: %d\n", value->value_count);

    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER1D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER2D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLER3D
     || value->type.parameter_type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
    {
        do_indent(indent + 1);
        printf("SAMPLER VALUES:\n");
        for (i = 0; i < value->value_count; i++)
        {
            MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];

            static const char *samplerstatetypes[] =
            {
                "UNKNOWN0",
                "UNKNOWN1",
                "UNKNOWN2",
                "UNKNOWN3",
                "TEXTURE",
                "ADDRESSU",
                "ADDRESSV",
                "ADDRESSW",
                "BORDERCOLOR",
                "MAGFILTER",
                "MINFILTER",
                "MIPFILTER",
                "MIPMAPLODBIAS",
                "MAXMIPLEVEL",
                "MAXANISOTROPY",
                "SRGBTEXTURE",
                "ELEMENTINDEX",
                "DMAPOFFSET",
            };
            do_indent(indent + 2);
            printf("TYPE: %s -> ", samplerstatetypes[state->type]);

            /* Assuming only one value per state! */
            if (state->type == MOJOSHADER_SAMP_MIPMAPLODBIAS)
            {
                /* float types */
                printf("%.2f\n", *state->value.valuesF);
            } // if
            else
            {
                /* int/enum types */
                printf("%d\n", *state->value.valuesI);
            } // else
        } // for
    } // if
    else
    {
        do_indent(indent + 1);
        printf("%s VALUES:\n", types[value->type.parameter_type]);
        i = 0;
        do
        {
            static const char *prints[] =
            {
                "%X ",
                "%d ",
                "%d ",
                "%.2f ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "%d ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "SAMPLER?! ",
                "%d ",
                "%d ",
                "%X "
            };
            for (r = 0; r < value->type.rows; r++)
            {
                do_indent(indent + 2);
                for (c = 0; c < value->type.columns; c++)
                {
                    const int offset = (i * value->type.rows * 4) + (r * 4) + c;
                    if (value->type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT)
                        printf(prints[value->type.parameter_type], value->valuesF[offset]);
                    else
                        printf(prints[value->type.parameter_type], value->valuesI[offset]);
                } // for
                printf("\n");
            } // for
        } while (++i < value->type.elements);
    } // else
}